

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::Error::Error(Error *this,string *name,string *msg,ExitCodes exit_code)

{
  string *in_RDX;
  string *in_RSI;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  Error *in_stack_ffffffffffffffa0;
  string local_40 [64];
  
  ::std::__cxx11::string::string(local_40,in_RSI);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffffa0,in_RDX);
  Error(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
        (int)((ulong)in_RDX >> 0x20));
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  ::std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

Error(std::string name, std::string msg, ExitCodes exit_code) : Error(name, msg, static_cast<int>(exit_code)) {}